

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

int __thiscall booster::aio::stream_socket::shutdown(stream_socket *this,int __fd,int __how)

{
  native_type __fd_00;
  uint uVar1;
  undefined8 *puVar2;
  undefined4 in_register_00000014;
  undefined8 *puVar3;
  error_code eVar4;
  int res;
  int method;
  undefined4 uStack_2c;
  int local_1c;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000014,__how);
  local_1c = 0;
  if (__fd == 0) {
    local_1c = 0;
  }
  else if (__fd == 1) {
    local_1c = 1;
  }
  else if (__fd == 2) {
    local_1c = 2;
  }
  __fd_00 = basic_io_device::native((basic_io_device *)this);
  uVar1 = ::shutdown(__fd_00,local_1c);
  puVar2 = (undefined8 *)(ulong)uVar1;
  if ((int)uVar1 < 0) {
    eVar4 = socket_details::geterror();
    *puVar3 = CONCAT44(uStack_2c,eVar4._M_value);
    puVar3[1] = eVar4._M_cat;
    puVar2 = puVar3;
  }
  return (int)puVar2;
}

Assistant:

void stream_socket::shutdown(how_type how,system::error_code &e)
{
	#ifndef SHUT_RDWR
	#define SHUT_RDWR SD_BOTH
	#endif
	#ifndef SHUT_WR
	#define SHUT_WR SD_SEND
	#endif
	#ifndef SHUT_RD
	#define SHUT_RD SD_RECEIVE
	#endif
	int method = 0;
	switch(how) {
	case shut_rd: method = SHUT_RD; break;
	case shut_wr: method = SHUT_WR; break;
	case shut_rdwr: method = SHUT_RDWR; break;
	}

	int res = ::shutdown(native(),method);
	if(res < 0)
		e=geterror();
}